

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O0

void __thiscall xray_re::_lzhuf::StartHuff(_lzhuf *this)

{
  int local_18;
  int local_14;
  int j;
  int i;
  _lzhuf *this_local;
  
  for (local_14 = 0; local_14 < 0x13a; local_14 = local_14 + 1) {
    this->freq[local_14] = 1;
    this->son[local_14] = local_14 + 0x273;
    this->prnt[local_14 + 0x273] = local_14;
  }
  local_14 = 0;
  for (local_18 = 0x13a; local_18 < 0x273; local_18 = local_18 + 1) {
    this->freq[local_18] = this->freq[local_14] + this->freq[local_14 + 1];
    this->son[local_18] = local_14;
    this->prnt[local_14 + 1] = local_18;
    this->prnt[local_14] = local_18;
    local_14 = local_14 + 2;
  }
  this->freq[0x273] = 0xffff;
  this->prnt[0x272] = 0;
  return;
}

Assistant:

void _lzhuf::StartHuff(void)
{
	int i, j;

	for (i = 0; i < N_CHAR; i++) {
		freq[i] = 1;
		son[i] = i + T;
		prnt[i + T] = i;
	}
	i = 0; j = N_CHAR;
	while (j <= R) {
		freq[j] = freq[i] + freq[i + 1];
		son[j] = i;
		prnt[i] = prnt[i + 1] = j;
		i += 2; j++;
	}
	freq[T] = 0xffff;
	prnt[R] = 0;
}